

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::operator()
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,
          basic_string_view<char> value)

{
  char cVar1;
  uint uVar2;
  iterator __dest;
  ulong __n;
  char **it;
  ptrdiff_t _Num;
  char *data;
  str_writer<char> local_30;
  
  __n = value.size_;
  local_30.s = value.data_;
  if (this->specs_ == (format_specs *)0x0) {
    __dest = (this->writer_).out_;
    if (__n != 0) {
      memmove(__dest,local_30.s,__n);
    }
    (this->writer_).out_ = __dest + __n;
  }
  else {
    cVar1 = (this->specs_->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_30,"invalid type specifier");
    }
    uVar2 = (this->specs_->super_core_format_specs).precision;
    local_30.size_ = (ulong)uVar2;
    if (__n <= uVar2) {
      local_30.size_ = __n;
    }
    if ((int)uVar2 < 0) {
      local_30.size_ = __n;
    }
    basic_writer<fmt::v5::output_range<char*,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<char*,char>> *)this,
               &this->specs_->super_align_spec,&local_30);
  }
  return (this->writer_).out_;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }